

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribfunction.cpp
# Opt level: O3

void __thiscall DistribFunction::DistribFunction(DistribFunction *this,char *fileName)

{
  int iVar1;
  FILE *__stream;
  double *__ptr;
  
  __stream = fopen(fileName,"rb");
  if (__stream != (FILE *)0x0) {
    fread(&this->numHistIntervals,4,1,__stream);
    fread(&this->minValExp,8,1,__stream);
    fread(&this->maxValExp,8,1,__stream);
    iVar1 = this->numHistIntervals;
    __ptr = (double *)malloc((long)iVar1 * 8);
    this->distrib = __ptr;
    fread(__ptr,8,(long)iVar1,__stream);
    fclose(__stream);
    return;
  }
  DistribFunction((DistribFunction *)fileName);
  free(((DistribFunction *)fileName)->distrib);
  return;
}

Assistant:

DistribFunction::DistribFunction( const char *fileName ){
    FILE *inpFile = fopen( fileName, "rb" );
    if ( inpFile == NULL ) { fprintf(stderr, "Probability distribution file not found\n"); exit(-1); /*return;*/ }
    fread( &numHistIntervals, sizeof(numHistIntervals), 1, inpFile );
    fread( &minValExp, sizeof(minValExp), 1, inpFile );
    fread( &maxValExp, sizeof(maxValExp), 1, inpFile );
    distrib = (double*)malloc( numHistIntervals*sizeof(distrib[0]));
    fread( distrib, sizeof(distrib[0]), numHistIntervals, inpFile );
    fclose( inpFile );
}